

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O3

int XNVCTRLSetTargetAttributeAndGetStatus
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,int value
              )

{
  _XLockPtrs *p_Var1;
  int iVar2;
  XExtDisplayInfo *pXVar3;
  undefined1 *puVar4;
  xnvCtrlSetAttributeAndGetStatusReply rep;
  undefined1 local_50 [8];
  int local_48;
  
  pXVar3 = find_display(dpy);
  iVar2 = 0;
  if ((pXVar3 != (XExtDisplayInfo *)0x0) && (iVar2 = 0, pXVar3->codes != (XExtCodes *)0x0)) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar4 = (undefined1 *)_XGetRequest(dpy,0x13,0x14);
    *puVar4 = (char)pXVar3->codes->major_opcode;
    puVar4[1] = 0x13;
    *(short *)(puVar4 + 6) = (short)target_type;
    *(short *)(puVar4 + 4) = (short)target_id;
    *(uint *)(puVar4 + 8) = display_mask;
    *(uint *)(puVar4 + 0xc) = attribute;
    *(int *)(puVar4 + 0x10) = value;
    iVar2 = _XReply(dpy,local_50,0,0);
    p_Var1 = dpy->lock_fns;
    if (iVar2 == 0) {
      if (p_Var1 != (_XLockPtrs *)0x0) {
        (*p_Var1->unlock_display)(dpy);
      }
      iVar2 = 0;
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
    }
    else {
      if (p_Var1 != (_XLockPtrs *)0x0) {
        (*p_Var1->unlock_display)(dpy);
      }
      iVar2 = local_48;
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
        iVar2 = local_48;
      }
    }
  }
  return iVar2;
}

Assistant:

Bool XNVCTRLSetTargetAttributeAndGetStatus (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeAndGetStatusReq *req;
    xnvCtrlSetAttributeAndGetStatusReply rep;
    Bool success;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttributeAndGetStatus, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttributeAndGetStatus;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}